

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

unique_ptr<duckdb::IndexScanState,_std::default_delete<duckdb::IndexScanState>,_true> __thiscall
duckdb::ART::TryInitializeScan(ART *this,Expression *expr,Expression *filter_expr)

{
  unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>,_true>
  uVar1;
  bool bVar2;
  ExpressionType type;
  ExpressionType expression_type;
  int iVar3;
  reference pvVar4;
  BoundComparisonExpression *pBVar5;
  BoundConstantExpression *pBVar6;
  pointer pEVar7;
  BoundBetweenExpression *pBVar8;
  pointer pAVar9;
  Expression *in_RCX;
  pointer *__ptr;
  Value *value;
  ExpressionType EVar10;
  vector<std::reference_wrapper<duckdb::Expression>,_true> bindings;
  Value constant_value;
  ComparisonExpressionMatcher matcher;
  LogicalType local_138;
  LogicalType local_120;
  LogicalType local_108;
  Value low_value;
  Value high_value;
  Value equal_value;
  
  LogicalType::LogicalType(&local_108,SQLNULL);
  Value::Value(&low_value,&local_108);
  LogicalType::~LogicalType(&local_108);
  LogicalType::LogicalType(&local_120,SQLNULL);
  Value::Value(&high_value,&local_120);
  LogicalType::~LogicalType(&local_120);
  LogicalType::LogicalType(&local_138,SQLNULL);
  Value::Value(&equal_value,&local_138);
  LogicalType::~LogicalType(&local_138);
  matcher.super_ExpressionMatcher.expr_class = BOUND_COMPARISON;
  matcher.super_ExpressionMatcher.expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
        )(__uniq_ptr_data<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>,_true,_true>
          )0x0;
  matcher.super_ExpressionMatcher.type.
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl =
       (unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>)
       (__uniq_ptr_data<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true,_true>)
       0x0;
  matcher.super_ExpressionMatcher._vptr_ExpressionMatcher =
       (_func_int **)&PTR__ComparisonExpressionMatcher_027ca198;
  matcher.matchers.
  super_vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  matcher.matchers.
  super_vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  matcher.matchers.
  super_vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  matcher.policy = INVALID;
  make_uniq<duckdb::ComparisonExpressionTypeMatcher>();
  uVar1 = matcher.super_ExpressionMatcher.expr_type;
  matcher.super_ExpressionMatcher.expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
        )(unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
          )constant_value.type_._0_8_;
  constant_value.type_.id_ = INVALID;
  constant_value.type_.physical_type_ = ~INVALID;
  constant_value.type_._2_6_ = 0;
  if (uVar1.
      super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
      .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)uVar1.
                          super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
                          .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>.
                          _M_head_impl + 8))();
    if (constant_value.type_._0_8_ != 0) {
      (**(code **)(*(long *)constant_value.type_._0_8_ + 8))();
    }
  }
  make_uniq<duckdb::ExpressionEqualityMatcher,duckdb::Expression_const&>
            ((duckdb *)&bindings,filter_expr);
  constant_value.type_._0_8_ =
       bindings.
       super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  bindings.
  super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&matcher.matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&constant_value);
  if (constant_value.type_._0_8_ != 0) {
    (**(code **)(*(long *)constant_value.type_._0_8_ + 8))();
  }
  constant_value.type_.id_ = INVALID;
  constant_value.type_.physical_type_ = ~INVALID;
  constant_value.type_._2_6_ = 0;
  if (bindings.
      super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)&((bindings.
                   super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_data->super_BaseExpression).type)
              ();
  }
  make_uniq<duckdb::ConstantExpressionMatcher>();
  constant_value.type_._0_8_ =
       bindings.
       super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  bindings.
  super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&matcher.matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&constant_value);
  if (constant_value.type_._0_8_ != 0) {
    (**(code **)(*(long *)constant_value.type_._0_8_ + 8))();
  }
  constant_value.type_.id_ = INVALID;
  constant_value.type_.physical_type_ = ~INVALID;
  constant_value.type_._2_6_ = 0;
  if (bindings.
      super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)&((bindings.
                   super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_data->super_BaseExpression).type)
              ();
  }
  matcher.policy = UNORDERED;
  bindings.
  super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bindings.
  super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bindings.
  super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = ComparisonExpressionMatcher::Match(&matcher,in_RCX,&bindings);
  if (bVar2) {
    pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>(&bindings,0);
    pBVar5 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                       (&pvVar4->_M_data->super_BaseExpression);
    pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>(&bindings,2);
    pBVar6 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                       (&pvVar4->_M_data->super_BaseExpression);
    Value::Value(&constant_value,&pBVar6->value);
    type = (pBVar5->super_Expression).super_BaseExpression.type;
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&pBVar5->left);
    if ((pEVar7->super_BaseExpression).type == VALUE_CONSTANT) {
      type = FlipComparisonExpression(type);
    }
    if (type == COMPARE_BOUNDARY_START) {
      Value::operator=(&equal_value,&constant_value);
      EVar10 = INVALID;
LAB_01a1fecb:
      type = INVALID;
    }
    else {
      if ((type & 0xfd) != COMPARE_GREATERTHAN) {
        Value::operator=(&high_value,&constant_value);
        EVar10 = type;
        goto LAB_01a1fecb;
      }
      Value::operator=(&low_value,&constant_value);
      EVar10 = INVALID;
    }
    Value::~Value(&constant_value);
LAB_01a1fed7:
    value = &equal_value;
    expression_type = COMPARE_BOUNDARY_START;
    if (equal_value.is_null == true) {
      if (low_value.is_null == true) {
        value = &high_value;
        expression_type = EVar10;
        if (high_value.is_null != false) goto LAB_01a1fefe;
      }
      else {
        if (high_value.is_null == false) {
          make_uniq<duckdb::ARTIndexScanState>();
          pAVar9 = unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                   ::operator->((unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                                 *)&constant_value);
          Value::operator=(pAVar9->values,&low_value);
          pAVar9 = unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                   ::operator->((unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                                 *)&constant_value);
          pAVar9->expressions[0] = type;
          pAVar9 = unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                   ::operator->((unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                                 *)&constant_value);
          Value::operator=(pAVar9->values + 1,&high_value);
          pAVar9 = unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                   ::operator->((unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                                 *)&constant_value);
          pAVar9->expressions[1] = EVar10;
          (this->super_BoundIndex).super_Index._vptr_Index =
               (_func_int **)constant_value.type_._0_8_;
          goto LAB_01a1ff20;
        }
        value = &low_value;
        expression_type = type;
      }
    }
    InitializeScanSinglePredicate((duckdb *)this,value,expression_type);
  }
  else {
    if ((in_RCX->super_BaseExpression).type != COMPARE_BETWEEN) {
      EVar10 = INVALID;
      type = INVALID;
      goto LAB_01a1fed7;
    }
    pBVar8 = BaseExpression::Cast<duckdb::BoundBetweenExpression>(&in_RCX->super_BaseExpression);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&pBVar8->input);
    iVar3 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[10])(pEVar7,filter_expr);
    if ((char)iVar3 != '\0') {
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&pBVar8->lower);
      if ((pEVar7->super_BaseExpression).type == VALUE_CONSTANT) {
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(&pBVar8->upper);
        if ((pEVar7->super_BaseExpression).type == VALUE_CONSTANT) {
          pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(&pBVar8->lower);
          pBVar6 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                             (&pEVar7->super_BaseExpression);
          Value::operator=(&low_value,&pBVar6->value);
          bVar2 = pBVar8->lower_inclusive;
          pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(&pBVar8->upper);
          pBVar6 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                             (&pEVar7->super_BaseExpression);
          Value::operator=(&high_value,&pBVar6->value);
          type = bVar2 * '\x02' | COMPARE_GREATERTHAN;
          EVar10 = pBVar8->upper_inclusive * '\x02' + COMPARE_LESSTHAN;
          goto LAB_01a1fed7;
        }
      }
    }
LAB_01a1fefe:
    (this->super_BoundIndex).super_Index._vptr_Index = (_func_int **)0x0;
  }
LAB_01a1ff20:
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                   *)&bindings);
  ComparisonExpressionMatcher::~ComparisonExpressionMatcher(&matcher);
  Value::~Value(&equal_value);
  Value::~Value(&high_value);
  Value::~Value(&low_value);
  return (unique_ptr<duckdb::IndexScanState,_std::default_delete<duckdb::IndexScanState>_>)
         (unique_ptr<duckdb::IndexScanState,_std::default_delete<duckdb::IndexScanState>_>)this;
}

Assistant:

unique_ptr<IndexScanState> ART::TryInitializeScan(const Expression &expr, const Expression &filter_expr) {
	Value low_value, high_value, equal_value;
	ExpressionType low_comparison_type = ExpressionType::INVALID, high_comparison_type = ExpressionType::INVALID;

	// Try to find a matching index for any of the filter expressions.
	ComparisonExpressionMatcher matcher;

	// Match on a comparison type.
	matcher.expr_type = make_uniq<ComparisonExpressionTypeMatcher>();

	// Match on a constant comparison with the indexed expression.
	matcher.matchers.push_back(make_uniq<ExpressionEqualityMatcher>(expr));
	matcher.matchers.push_back(make_uniq<ConstantExpressionMatcher>());
	matcher.policy = SetMatcher::Policy::UNORDERED;

	vector<reference<Expression>> bindings;
	auto filter_match =
	    matcher.Match(const_cast<Expression &>(filter_expr), bindings); // NOLINT: Match does not alter the expr.
	if (filter_match) {
		// This is a range or equality comparison with a constant value, so we can use the index.
		// 		bindings[0] = the expression
		// 		bindings[1] = the index expression
		// 		bindings[2] = the constant
		auto &comparison = bindings[0].get().Cast<BoundComparisonExpression>();
		auto constant_value = bindings[2].get().Cast<BoundConstantExpression>().value;
		auto comparison_type = comparison.GetExpressionType();

		if (comparison.left->GetExpressionType() == ExpressionType::VALUE_CONSTANT) {
			// The expression is on the right side, we flip the comparison expression.
			comparison_type = FlipComparisonExpression(comparison_type);
		}

		if (comparison_type == ExpressionType::COMPARE_EQUAL) {
			// An equality value overrides any other bounds.
			equal_value = constant_value;
		} else if (comparison_type == ExpressionType::COMPARE_GREATERTHANOREQUALTO ||
		           comparison_type == ExpressionType::COMPARE_GREATERTHAN) {
			// This is a lower bound.
			low_value = constant_value;
			low_comparison_type = comparison_type;
		} else {
			// This is an upper bound.
			high_value = constant_value;
			high_comparison_type = comparison_type;
		}

	} else if (filter_expr.GetExpressionType() == ExpressionType::COMPARE_BETWEEN) {
		auto &between = filter_expr.Cast<BoundBetweenExpression>();
		if (!between.input->Equals(expr)) {
			// The expression does not match the index expression.
			return nullptr;
		}

		if (between.lower->GetExpressionType() != ExpressionType::VALUE_CONSTANT ||
		    between.upper->GetExpressionType() != ExpressionType::VALUE_CONSTANT) {
			// Not a constant expression.
			return nullptr;
		}

		low_value = between.lower->Cast<BoundConstantExpression>().value;
		low_comparison_type = between.lower_inclusive ? ExpressionType::COMPARE_GREATERTHANOREQUALTO
		                                              : ExpressionType::COMPARE_GREATERTHAN;
		high_value = (between.upper->Cast<BoundConstantExpression>()).value;
		high_comparison_type =
		    between.upper_inclusive ? ExpressionType::COMPARE_LESSTHANOREQUALTO : ExpressionType::COMPARE_LESSTHAN;
	}

	// We cannot use an index scan.
	if (equal_value.IsNull() && low_value.IsNull() && high_value.IsNull()) {
		return nullptr;
	}

	// Initialize the index scan state and return it.
	if (!equal_value.IsNull()) {
		// Equality predicate.
		return InitializeScanSinglePredicate(equal_value, ExpressionType::COMPARE_EQUAL);
	}
	if (!low_value.IsNull() && !high_value.IsNull()) {
		// Two-sided predicate.
		return InitializeScanTwoPredicates(low_value, low_comparison_type, high_value, high_comparison_type);
	}
	if (!low_value.IsNull()) {
		// Less-than predicate.
		return InitializeScanSinglePredicate(low_value, low_comparison_type);
	}
	// Greater-than predicate.
	return InitializeScanSinglePredicate(high_value, high_comparison_type);
}